

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-opt.h
# Opt level: O2

void __thiscall
mp::
TypedSolverOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::Parse(TypedSolverOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *this,char **s,bool splitString)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  string local_50;
  
  value._M_dataplus._M_p = (pointer)&value.field_2;
  value._M_string_length = 0;
  value.field_2._M_local_buf[0] = '\0';
  internal::
  OptionHelper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parse(&local_50,s,splitString);
  std::__cxx11::string::operator=((string *)&value,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  (*(this->super_SolverOption)._vptr_SolverOption[9])
            (this,value._M_dataplus._M_p,value._M_string_length);
  std::__cxx11::string::~string((string *)&value);
  return;
}

Assistant:

void Parse(const char *&s, bool splitString=false) override {
    const char *start = s;
    T value;
    try {
      value = internal::OptionHelper<T>::Parse(s, splitString);
    } catch (const std::exception& exc) {
      // undocumented: we accept next option after a numeric option
      s = SkipNonSpaces(s);
      throw InvalidOptionValue(name(),
                               std::string(start, s - start),
                               exc.what());
    }
    SetValue(value);
  }